

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_databases.cc
# Opt level: O2

int __thiscall
aliyun::Rds::DescribeDatabases
          (Rds *this,RdsDescribeDatabasesRequestType *req,RdsDescribeDatabasesResponseType *response
          ,RdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *this_01;
  char *pcVar6;
  uint index;
  uint index_00;
  allocator<char> local_5d4;
  allocator<char> local_5d3;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  Value val;
  undefined1 local_5a8 [24];
  string local_590 [8];
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  _Alloc_hider local_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  _Alloc_hider local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Alloc_hider local_510;
  size_type local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  _Alloc_hider local_4f0;
  size_type local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  Value *local_4c8;
  undefined1 local_4c0 [32];
  _Alloc_hider local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  string str_response;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&local_460);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeDatabases",(allocator<char> *)local_4c0);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"DBInstanceId",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->db_instance_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->db_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"DBName",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->db_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->db_status)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"DBStatus",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->db_status);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"OwnerAccount",(allocator<char> *)local_5a8);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"RegionId",(allocator<char> *)local_5a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,this->region_id_,(allocator<char> *)local_4c0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5a8,anon_var_dwarf_2e8ef7 + 9,&local_5d1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_5a8);
        std::__cxx11::string::~string((string *)local_5a8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5a8,anon_var_dwarf_2e8ef7 + 9,&local_5d2);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_5a8);
        std::__cxx11::string::~string((string *)local_5a8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5a8,anon_var_dwarf_2e8ef7 + 9,&local_5d3);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_5a8);
        std::__cxx11::string::~string((string *)local_5a8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5a8,anon_var_dwarf_2e8ef7 + 9,&local_5d4);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_5a8);
        std::__cxx11::string::~string((string *)local_5a8);
      }
      if (response != (RdsDescribeDatabasesResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Databases");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Databases");
          bVar1 = Json::Value::isMember(pVVar4,"Database");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Databases");
            pVVar4 = Json::Value::operator[](pVVar4,"Database");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_4c8 = pVVar4;
              for (index_00 = 0; pVVar4 = local_4c8, AVar3 = Json::Value::size(local_4c8),
                  index_00 < AVar3; index_00 = index_00 + 1) {
                local_5a8._0_8_ = (pointer)0x0;
                local_5a8._8_8_ = (pointer)0x0;
                local_5a8._16_8_ = 0;
                local_590 = (string  [8])&local_580;
                local_588 = 0;
                local_580._M_local_buf[0] = '\0';
                local_570._M_p = (pointer)&local_560;
                local_568 = 0;
                local_560._M_local_buf[0] = '\0';
                local_550._M_p = (pointer)&local_540;
                local_548 = 0;
                local_540._M_local_buf[0] = '\0';
                local_530._M_p = (pointer)&local_520;
                local_528 = 0;
                local_520._M_local_buf[0] = '\0';
                local_510._M_p = (pointer)&local_500;
                local_508 = 0;
                local_500._M_local_buf[0] = '\0';
                local_4f0._M_p = (pointer)&local_4e0;
                local_4e8 = 0;
                local_4e0._M_local_buf[0] = '\0';
                pVVar4 = Json::Value::operator[](pVVar4,index_00);
                bVar1 = Json::Value::isMember(pVVar4,"DBName");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"DBName");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=(local_590,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"DBInstanceId");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"DBInstanceId");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_570,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"Engine");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"Engine");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_550,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"DBStatus");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"DBStatus");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_530,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"CharacterSetName");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"CharacterSetName");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_510,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"DBDescription");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"DBDescription");
                  Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_4f0,(string *)local_4c0);
                  std::__cxx11::string::~string((string *)local_4c0);
                }
                bVar1 = Json::Value::isMember(pVVar4,"Accounts");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"Accounts");
                  bVar1 = Json::Value::isMember(pVVar5,"AccountPrivilegeInfo");
                  if (bVar1) {
                    pVVar4 = Json::Value::operator[](pVVar4,"Accounts");
                    pVVar4 = Json::Value::operator[](pVVar4,"AccountPrivilegeInfo");
                    bVar1 = Json::Value::isArray(pVVar4);
                    if (bVar1) {
                      for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3;
                          index = index + 1) {
                        local_4c0._0_8_ = local_4c0 + 0x10;
                        local_4c0._8_8_ = 0;
                        local_4c0[0x10] = '\0';
                        local_4a0._M_p = (pointer)&local_490;
                        local_498 = 0;
                        local_490._M_local_buf[0] = '\0';
                        pVVar5 = Json::Value::operator[](pVVar4,index);
                        bVar1 = Json::Value::isMember(pVVar5,"Account");
                        if (bVar1) {
                          this_01 = Json::Value::operator[](pVVar5,"Account");
                          Json::Value::asString_abi_cxx11_(&local_460,this_01);
                          std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_460);
                          std::__cxx11::string::~string((string *)&local_460);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"AccountPrivilege");
                        if (bVar1) {
                          pVVar5 = Json::Value::operator[](pVVar5,"AccountPrivilege");
                          Json::Value::asString_abi_cxx11_(&local_460,pVVar5);
                          std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_460)
                          ;
                          std::__cxx11::string::~string((string *)&local_460);
                        }
                        std::
                        vector<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType,_std::allocator<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>_>
                        ::push_back((vector<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType,_std::allocator<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>_>
                                     *)local_5a8,
                                    (RdsDescribeDatabasesAccountPrivilegeInfoType *)local_4c0);
                        RdsDescribeDatabasesAccountPrivilegeInfoType::
                        ~RdsDescribeDatabasesAccountPrivilegeInfoType
                                  ((RdsDescribeDatabasesAccountPrivilegeInfoType *)local_4c0);
                      }
                    }
                  }
                }
                std::
                vector<aliyun::RdsDescribeDatabasesDatabaseType,_std::allocator<aliyun::RdsDescribeDatabasesDatabaseType>_>
                ::push_back(&response->databases,(value_type *)local_5a8);
                RdsDescribeDatabasesDatabaseType::~RdsDescribeDatabasesDatabaseType
                          ((RdsDescribeDatabasesDatabaseType *)local_5a8);
              }
              iVar2 = 200;
            }
          }
        }
      }
      goto LAB_001633f4;
    }
  }
  iVar2 = -1;
  if (error_info != (RdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001633f4:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Rds::DescribeDatabases(const RdsDescribeDatabasesRequestType& req,
                      RdsDescribeDatabasesResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDatabases");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.db_name.empty()) {
    req_rpc->AddRequestQuery("DBName", req.db_name);
  }
  if(!req.db_status.empty()) {
    req_rpc->AddRequestQuery("DBStatus", req.db_status);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}